

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

Bool prvTidyIsPushedLast(TidyDocImpl *doc,Node *element,Node *node)

{
  uint uVar1;
  Dict *pDVar2;
  
  if (((element == (Node *)0x0) ||
      ((((pDVar2 = element->tag, pDVar2 != (Dict *)0x0 && ((pDVar2->model & 0x810) == 0x10)) &&
        (pDVar2->id != TidyTag_DEL)) && (pDVar2->id != TidyTag_INS)))) &&
     ((uVar1 = doc->lexer->istacksize, uVar1 != 0 &&
      (doc->lexer->istack[uVar1 - 1].tag == node->tag)))) {
    return yes;
  }
  return no;
}

Assistant:

Bool TY_(IsPushedLast)( TidyDocImpl* doc, Node *element, Node *node )
{
    Lexer* lexer = doc->lexer;

    if ( element && !IsNodePushable(element) )
        return no;

    if (lexer->istacksize > 0) {
        if (lexer->istack[lexer->istacksize - 1].tag == node->tag) {
            return yes;
        }
    }

    return no;
}